

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O1

int scope_export_cb_iterate(set s,set_key key,set_value val,set_cb_iterate_args args)

{
  long lVar1;
  value v;
  value *ppvVar2;
  size_t length;
  value pvVar3;
  
  v = value_create_array((value *)0x0,2);
  if (v != (value)0x0) {
    ppvVar2 = value_to_array(v);
    length = strlen((char *)key);
    pvVar3 = value_create_string((char *)key,length);
    *ppvVar2 = pvVar3;
    if (pvVar3 != (value)0x0) {
      pvVar3 = value_type_copy(val);
      ppvVar2[1] = pvVar3;
      if (pvVar3 != (value)0x0) {
        lVar1 = *args;
        *(value *)(*(long *)((long)args + 8) + lVar1 * 8) = v;
        *(long *)args = lVar1 + 1;
        return 0;
      }
    }
    value_type_destroy(v);
  }
  return 0;
}

Assistant:

int scope_export_cb_iterate(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	scope_export_cb_iterator export_iterator = (scope_export_cb_iterator)args;

	const char *key_str = (const char *)key;

	value *v_array, v = value_create_array(NULL, 2);

	(void)s;

	if (v == NULL)
	{
		return 0;
	}

	v_array = value_to_array(v);

	v_array[0] = value_create_string(key_str, strlen(key_str));

	if (v_array[0] == NULL)
	{
		value_type_destroy(v);

		return 0;
	}

	v_array[1] = value_type_copy(val);

	if (v_array[1] == NULL)
	{
		value_type_destroy(v);

		return 0;
	}

	export_iterator->values[export_iterator->iterator] = v;
	++export_iterator->iterator;

	return 0;
}